

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void out_token(c2m_ctx_t c2m_ctx,token_t t)

{
  pre_ctx *ppVar1;
  pre_ctx *ppVar2;
  _func_void_c2m_ctx_t_token_t *p_Var3;
  size_t sVar4;
  token_t ptVar5;
  size_t i;
  ulong ix;
  
  ppVar1 = c2m_ctx->pre_ctx;
  if (ppVar1->no_out_p == 0) {
    sVar4 = VARR_macro_call_tlength(ppVar1->macro_call_stack);
    if (sVar4 == 0) {
      ppVar2 = c2m_ctx->pre_ctx;
      ix = 0;
      while( true ) {
        sVar4 = VARR_token_tlength(ppVar2->output_buffer);
        if (sVar4 <= ix) break;
        p_Var3 = ppVar2->pre_out_token_func;
        ptVar5 = VARR_token_tget(ppVar2->output_buffer,ix);
        (*p_Var3)(c2m_ctx,ptVar5);
        ix = ix + 1;
      }
      VARR_token_ttrunc(ppVar2->output_buffer,0);
      (*ppVar1->pre_out_token_func)(c2m_ctx,t);
      return;
    }
  }
  VARR_token_tpush(ppVar1->output_buffer,t);
  return;
}

Assistant:

static void out_token (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (no_out_p || VARR_LENGTH (macro_call_t, macro_call_stack) != 0) {
    VARR_PUSH (token_t, output_buffer, t);
    return;
  }
  flush_buffer (c2m_ctx);
  pre_out_token_func (c2m_ctx, t);
}